

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstructCondense<double>::ContributeKULocal
          (TPZDohrSubstructCondense<double> *this,double alpha,TPZFMatrix<double> *u,
          TPZFMatrix<double> *z)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int64_t iVar4;
  const_iterator this_00;
  const_iterator rows;
  double *pdVar5;
  TPZMatRed<double,_TPZFMatrix<double>_> *permute;
  pointer ppVar6;
  TPZFMatrix<double> *input;
  TPZBaseMatrix *in_RDX;
  TPZBaseMatrix *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  int zcols;
  TPZFMatrix<double> resloc;
  TPZFMatrix<double> resglobal;
  const_iterator itrelat2;
  const_iterator itrelat;
  Numbering relat2;
  Numbering relat;
  TPZFMatrix<double> resborder;
  TPZFMatrix<double> uborder;
  TPZFMatrix<double> uloc;
  int neqs;
  int ncols;
  int nglob;
  int j;
  int i;
  map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
  *in_stack_fffffffffffffbe8;
  double dVar7;
  double *in_stack_fffffffffffffc00;
  undefined8 in_stack_fffffffffffffc08;
  TPZFMatrix<double> *in_stack_fffffffffffffc10;
  TPZFMatrix<double> *output;
  TPZFMatrix<double> *in_stack_fffffffffffffc18;
  TPZVec<int> *in_stack_fffffffffffffc20;
  double *in_stack_fffffffffffffc38;
  undefined7 in_stack_fffffffffffffc40;
  undefined1 in_stack_fffffffffffffc47;
  undefined1 uVar8;
  int64_t in_stack_fffffffffffffc48;
  TPZFMatrix<double> *in_stack_fffffffffffffc50;
  _Self local_260;
  _Self local_258;
  _Base_ptr local_250;
  _Base_ptr local_248;
  _Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>
  local_240;
  _Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>
  local_238;
  ENumbering local_230 [2];
  pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>
  local_228;
  ENumbering local_220 [2];
  pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>
  local_218;
  undefined8 local_210;
  undefined1 local_208 [160];
  undefined8 local_168;
  undefined1 local_160 [144];
  undefined8 local_d0;
  int local_34;
  undefined4 local_30;
  undefined4 local_2c;
  int local_28;
  int local_24;
  TPZBaseMatrix *local_20;
  TPZBaseMatrix *local_18;
  double local_10;
  
  local_2c = *(undefined4 *)(in_RDI + 0x10);
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_XMM0_Qa;
  iVar4 = TPZBaseMatrix::Cols(in_RSI);
  local_30 = (undefined4)iVar4;
  local_34 = *(int *)(in_RDI + 0x10) - *(int *)(in_RDI + 0x14);
  local_d0 = 0;
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
             CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),in_stack_fffffffffffffc38
            );
  local_168 = 0;
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
             CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),in_stack_fffffffffffffc38
            );
  local_210 = 0;
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
             CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),in_stack_fffffffffffffc38
            );
  local_220[1] = 2;
  local_220[0] = Submesh;
  std::
  pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>::
  pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering,_true>
            (&local_218,local_220 + 1,local_220);
  local_230[1] = 1;
  local_230[0] = Submesh;
  std::
  pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>::
  pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering,_true>
            (&local_228,local_230 + 1,local_230);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>
  ::_Rb_tree_const_iterator(&local_238);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>
  ::_Rb_tree_const_iterator(&local_240);
  this_00 = std::
            map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
            ::find(in_stack_fffffffffffffbe8,(key_type *)0x1fa8e3b);
  local_248 = this_00._M_node;
  local_238._M_node = this_00._M_node;
  rows = std::
         map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
         ::find(in_stack_fffffffffffffbe8,(key_type *)0x1fa8e78);
  local_250 = rows._M_node;
  local_240._M_node = rows._M_node;
  local_258._M_node =
       (_Base_ptr)
       std::
       map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
       ::end(in_stack_fffffffffffffbe8);
  bVar2 = std::operator==(&local_238,&local_258);
  uVar8 = true;
  if (!bVar2) {
    local_260._M_node =
         (_Base_ptr)
         std::
         map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
         ::end(in_stack_fffffffffffffbe8);
    uVar8 = std::operator==(&local_240,&local_260);
  }
  if ((bool)uVar8 == false) {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>
                  *)0x1fa8f7b);
    pdVar5 = (double *)TPZBaseMatrix::Rows(local_18);
    PermuteScatter(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                   (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),(int)in_stack_fffffffffffffc08);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>
                  *)0x1fa8fcd);
    PermuteGather(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                  (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),(int)in_stack_fffffffffffffc08);
    permute = TPZAutoPointer<TPZMatRed<double,_TPZFMatrix<double>_>_>::operator->
                        ((TPZAutoPointer<TPZMatRed<double,_TPZFMatrix<double>_>_> *)(in_RDI + 0x298)
                        );
    (*(permute->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x25]
    )(permute,local_160,local_208,0);
    TPZFMatrix<double>::TPZFMatrix
              ((TPZFMatrix<double> *)this_00._M_node,(int64_t)rows._M_node,
               CONCAT17(uVar8,in_stack_fffffffffffffc40),pdVar5);
    TPZFMatrix<double>::TPZFMatrix
              ((TPZFMatrix<double> *)this_00._M_node,(int64_t)rows._M_node,
               CONCAT17(uVar8,in_stack_fffffffffffffc40),pdVar5);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>
                  *)0x1fa90a8);
    PermuteScatter((TPZVec<int> *)permute,in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                   (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),(int)in_stack_fffffffffffffc08);
    ppVar6 = std::
             _Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>
                           *)0x1fa90df);
    output = (TPZFMatrix<double> *)&ppVar6->second;
    input = (TPZFMatrix<double> *)TPZBaseMatrix::Rows(local_18);
    PermuteGather((TPZVec<int> *)permute,input,output,
                  (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),(int)in_stack_fffffffffffffc08);
    iVar4 = TPZBaseMatrix::Cols(local_20);
    iVar3 = (int)iVar4;
    for (local_24 = 0; local_24 < local_34; local_24 = local_24 + 1) {
      for (local_28 = 0; dVar1 = local_10, local_28 < iVar3; local_28 = local_28 + 1) {
        in_stack_fffffffffffffc00 =
             TPZFMatrix<double>::operator()(output,iVar4,(int64_t)in_stack_fffffffffffffc00);
        dVar7 = *in_stack_fffffffffffffc00;
        pdVar5 = TPZFMatrix<double>::operator()(output,iVar4,(int64_t)in_stack_fffffffffffffc00);
        *pdVar5 = dVar1 * dVar7 + *pdVar5;
      }
    }
    TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1fa9276);
    TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1fa9283);
  }
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1fa929b);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1fa92a8);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1fa92b5);
  return;
}

Assistant:

void TPZDohrSubstructCondense<TVar>::ContributeKULocal(const TVar alpha, const TPZFMatrix<TVar> &u, TPZFMatrix<TVar> &z) const
{
	int i,j;
	int nglob = fNEquations;
	int ncols = u.Cols();
	int neqs = fNEquations-fNumInternalEquations;
	TPZFMatrix<TVar> uloc(nglob,ncols,0.), uborder(fNEquations-fNumInternalEquations,ncols,0.),resborder(fNEquations-fNumInternalEquations,ncols,0.);
	typedef std::pair<ENumbering,ENumbering> Numbering;
	Numbering relat(ExternalFirst,Submesh);
	Numbering relat2(InternalFirst,Submesh);
	typename std::map<std::pair<ENumbering, ENumbering> , TPZVec<int> >::const_iterator itrelat, itrelat2;
	itrelat = fPermutationsScatter.find(relat);
	itrelat2 = fPermutationsScatter.find(relat2);
	if(itrelat == fPermutationsScatter.end() || itrelat2 == fPermutationsScatter.end())
	{
		return;
	}
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Scatter from external do submesh" << itrelat->second << std::endl;
		sout << "Scatter from submesh to internal" << itrelat2->second << std::endl;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	PermuteScatter(itrelat->second, u, uloc, 0, u.Rows());
	PermuteGather(itrelat2->second, uloc, uborder, fNumInternalEquations, fNEquations);
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		u.Print("Input matrix ", sout);
		uloc.Print("Natural ordering matrix",sout);
		uborder.Print("Matrix passed to the matred object", sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	fMatRed->Multiply(uborder,resborder);
	
	TPZFMatrix<TVar> resglobal(nglob,ncols,0.),resloc(fNumExternalEquations,ncols,0.);
	PermuteScatter(itrelat2->second, resborder, resglobal, fNumInternalEquations, fNEquations);
	PermuteGather(itrelat->second, resglobal, resloc, 0, u.Rows());
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Value of the local multiply = ";
		resborder.Print("resborder " ,sout);
		resglobal.Print("resglobal ",sout);
		resloc.Print("resloc ",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
	int zcols = z.Cols();
	for (i=0;i<neqs;i++) {
		/* Sum row "i" of temp1 with row "fGlobalNodes[i]" of z */
		for (j=0;j<zcols;j++) {
			z(i,j) += alpha*resloc(i,j);
		}
	}
}